

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Increment_Full(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  double value;
  double inc;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    aRight_local = TaggedInt::Increment(aRight,scriptContext);
  }
  else {
    bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
    if (bVar1) {
      aRight_local = JavascriptBigInt::Increment(aRight);
    }
    else {
      value = Increment_Helper(aRight,scriptContext);
      aRight_local = JavascriptNumber::ToVarIntCheck(value,scriptContext);
    }
  }
  return aRight_local;
}

Assistant:

Var JavascriptMath::Increment_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Increment_Full);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Increment(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }

            double inc = Increment_Helper(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(inc, scriptContext);
            JIT_HELPER_END(Op_Increment_Full);
        }